

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSConverter.cpp
# Opt level: O1

void __thiscall
Assimp::Discreet3DSImporter::AddNodeToGraph
          (Discreet3DSImporter *this,aiScene *pcSOut,aiNode *pcOut,Node *pcIn,aiMatrix4x4 *param_4)

{
  vector<aiQuatKey,_std::allocator<aiQuatKey>_> *this_00;
  aiVector3D *paVar1;
  float *pfVar2;
  undefined8 *puVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  aiColor4D *paVar19;
  size_t __n;
  size_t sVar20;
  aiMesh *paVar21;
  pointer pcVar22;
  pointer paVar23;
  aiAnimation *paVar24;
  aiCamera *paVar25;
  aiLight *paVar26;
  bool bVar27;
  bool bVar28;
  undefined8 uVar29;
  Discreet3DSImporter *this_01;
  int iVar30;
  iterator it;
  uint *puVar31;
  Logger *pLVar32;
  aiVector3D *paVar33;
  pointer paVar34;
  pointer paVar35;
  aiNodeAnim *paVar36;
  aiVectorKey *paVar37;
  aiQuatKey *paVar38;
  aiNode **ppaVar39;
  aiNode *this_02;
  ulong uVar40;
  aiVector3D *paVar41;
  ulong uVar42;
  long lVar43;
  aiQuatKey *paVar44;
  uint uVar45;
  ulong uVar46;
  char *pcVar47;
  char *pcVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  vector<unsigned_int,_std::allocator<unsigned_int>_> iArray;
  aiMatrix4x4 mInv;
  char tmp [12];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_128;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f4;
  float local_f0;
  float local_ec;
  aiMatrix4x4t<float> local_e8;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  Discreet3DSImporter *local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  char local_3c [12];
  
  local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint *)0x0;
  local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_70 = this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&local_128,3);
  local_e8._0_8_ = (ulong)(uint)local_e8.a2 << 0x20;
  if (pcSOut->mNumMeshes != 0) {
    uVar40 = 0;
    do {
      paVar19 = pcSOut->mMeshes[uVar40]->mColors[0];
      if (paVar19 == (aiColor4D *)0x0) {
        __assert_fail("__null != pcMesh",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/3DS/3DSConverter.cpp"
                      ,0x1cb,
                      "void Assimp::Discreet3DSImporter::AddNodeToGraph(aiScene *, aiNode *, D3DS::Node *, aiMatrix4x4 &)"
                     );
      }
      __n = (pcIn->mName)._M_string_length;
      sVar20._0_4_ = paVar19[5].r;
      sVar20._4_4_ = paVar19[5].g;
      if ((__n == sVar20) &&
         ((__n == 0 ||
          (iVar30 = bcmp((pcIn->mName)._M_dataplus._M_p,*(void **)&paVar19[4].b,__n), iVar30 == 0)))
         ) {
        if (local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_128,
                     (iterator)
                     local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_e8);
        }
        else {
          *local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = (uint)uVar40;
          local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      uVar45 = (int)local_e8.a1 + 1;
      uVar40 = (ulong)uVar45;
      local_e8.a1 = (float)uVar45;
    } while (uVar45 < pcSOut->mNumMeshes);
  }
  if (local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    paVar19 = pcSOut->mMeshes
              [*local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start]->mColors[0];
    local_e8._0_8_ = *(undefined8 *)&paVar19[9].b;
    local_e8.a3 = paVar19[10].r;
    local_e8.a4 = paVar19[10].g;
    local_e8.b1 = paVar19[10].b;
    local_e8.b2 = paVar19[10].a;
    local_e8.b3 = paVar19[0xb].r;
    local_e8.b4 = paVar19[0xb].g;
    local_e8.c1 = paVar19[0xb].b;
    local_e8.c2 = paVar19[0xb].a;
    local_e8.c3 = paVar19[0xc].r;
    local_e8.c4 = paVar19[0xc].g;
    local_e8.d1 = paVar19[0xc].b;
    local_e8.d2 = paVar19[0xc].a;
    local_e8.d3 = paVar19[0xd].r;
    local_e8.d4 = paVar19[0xd].g;
    local_88 = paVar19[9].b;
    local_98 = paVar19[9].a;
    fVar50 = paVar19[10].r;
    local_108 = paVar19[10].b;
    local_a8 = paVar19[10].a;
    fVar49 = paVar19[0xb].r;
    fVar54 = paVar19[0xb].b;
    fVar55 = paVar19[0xb].a;
    fVar15 = paVar19[0xc].r;
    local_ec = paVar19[0xc].b;
    local_f0 = paVar19[0xc].a;
    local_f4 = paVar19[0xd].r;
    aiMatrix4x4t<float>::Inverse(&local_e8);
    local_58 = ZEXT416((uint)(pcIn->vPivot).x);
    local_68 = ZEXT416((uint)(pcIn->vPivot).y);
    fVar16 = (pcIn->vPivot).z;
    uVar40 = (long)local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start >> 2;
    pcOut->mNumMeshes = (uint)uVar40;
    puVar31 = (uint *)operator_new__(-(ulong)(uVar40 >> 0x3e != 0) |
                                     (long)local_128.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_128.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_start);
    pcOut->mMeshes = puVar31;
    if (local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      bVar27 = (float)local_68._0_4_ != 0.0;
      bVar28 = (float)local_58._0_4_ != 0.0;
      uVar40 = 0;
      fVar17 = local_88;
      fVar18 = local_98;
      do {
        uVar45 = local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar40];
        paVar21 = pcSOut->mMeshes[uVar45];
        if (paVar21->mColors[1] == (aiColor4D *)0x0) {
          paVar33 = paVar21->mVertices;
          paVar1 = paVar33 + paVar21->mNumVertices;
          if ((ulong)paVar21->mNumVertices != 0) {
            paVar41 = paVar21->mNormals;
            lVar43 = 0;
            do {
              pfVar2 = (float *)((long)&paVar33->x + lVar43);
              fVar51 = *pfVar2;
              fVar52 = pfVar2[1];
              fVar53 = pfVar2[2];
              *(ulong *)pfVar2 =
                   CONCAT44(local_e8.b3 * fVar53 + local_e8.b1 * fVar51 + local_e8.b2 * fVar52 +
                            local_e8.b4,
                            local_e8.a3 * fVar53 + local_e8.a1 * fVar51 + local_e8.a2 * fVar52 +
                            local_e8.a4);
              pfVar2[2] = fVar53 * local_e8.c3 + fVar51 * local_e8.c1 + fVar52 * local_e8.c2 +
                          local_e8.c4;
              fVar51 = *(float *)((long)&paVar41->x + lVar43);
              fVar52 = *(float *)((long)&paVar41->y + lVar43);
              fVar53 = *(float *)((long)&paVar41->z + lVar43);
              *(ulong *)((long)&paVar41->x + lVar43) =
                   CONCAT44(fVar55 * fVar53 + fVar18 * fVar51 + local_a8 * fVar52 + local_f0,
                            fVar54 * fVar53 + fVar17 * fVar51 + local_108 * fVar52 + local_ec);
              *(float *)((long)&paVar41->z + lVar43) =
                   fVar53 * fVar15 + fVar51 * fVar50 + fVar52 * fVar49 + local_f4;
              lVar43 = lVar43 + 0xc;
            } while ((aiVector3D *)(pfVar2 + 3) != paVar1);
          }
          fVar17 = paVar19[10].a;
          fVar18 = paVar19[9].b;
          fVar51 = paVar19[9].a;
          fVar52 = paVar19[0xc].r;
          fVar53 = paVar19[0xd].g;
          fVar4 = paVar19[0xc].g;
          fVar5 = paVar19[0xd].r;
          fVar6 = paVar19[0xb].r;
          fVar7 = paVar19[0xc].a;
          fVar8 = paVar19[0xb].a;
          fVar9 = paVar19[0xb].g;
          fVar10 = paVar19[0xc].b;
          fVar11 = paVar19[0xb].b;
          fVar12 = paVar19[10].b;
          fVar13 = paVar19[10].r;
          fVar14 = paVar19[10].g;
          if (fVar6 * fVar14 * fVar8 * fVar10 +
              ((fVar17 * fVar14 * fVar11 * fVar5 +
               ((fVar12 * fVar14 * fVar52 * fVar7 +
                (((fVar4 * fVar13 * fVar17 * fVar10 +
                  ((fVar8 * fVar12 * fVar13 * fVar53 +
                   ((fVar11 * fVar9 * fVar13 * fVar7 +
                    fVar51 * fVar12 * fVar4 * fVar5 +
                    ((fVar9 * fVar51 * fVar52 * fVar10 +
                     ((fVar6 * fVar51 * fVar11 * fVar53 +
                      (((fVar8 * fVar18 * fVar9 * fVar5 +
                        ((fVar4 * fVar18 * fVar6 * fVar7 +
                         (fVar18 * fVar17 * fVar52 * fVar53 - fVar4 * fVar18 * fVar17 * fVar5)) -
                        fVar18 * fVar6 * fVar8 * fVar53)) - fVar18 * fVar9 * fVar52 * fVar7) -
                      fVar4 * fVar6 * fVar51 * fVar10)) - fVar11 * fVar9 * fVar51 * fVar5)) -
                    fVar52 * fVar51 * fVar12 * fVar53)) - fVar9 * fVar13 * fVar8 * fVar10)) -
                  fVar12 * fVar13 * fVar4 * fVar7)) - fVar13 * fVar17 * fVar11 * fVar53) -
                fVar8 * fVar12 * fVar14 * fVar5)) - fVar52 * fVar17 * fVar14 * fVar10)) -
              fVar11 * fVar6 * fVar14 * fVar7) < 0.0) {
            paVar33 = paVar21->mVertices;
            if (paVar33 != paVar1) {
              paVar41 = paVar21->mNormals;
              do {
                paVar33->x = -paVar33->x;
                paVar41->x = -paVar41->x;
                paVar33 = paVar33 + 1;
                paVar41 = paVar41 + 1;
              } while (paVar33 != paVar1);
            }
            pLVar32 = DefaultLogger::get();
            Logger::info(pLVar32,"3DS: Flipping mesh X-Axis");
          }
          fVar17 = local_88;
          fVar18 = local_98;
          if (fVar16 != 0.0 || (bVar27 || bVar28)) {
            for (paVar33 = paVar21->mVertices; paVar33 != paVar1; paVar33 = paVar33 + 1) {
              paVar33->x = paVar33->x - (float)local_58._0_4_;
              paVar33->y = paVar33->y - (float)local_68._0_4_;
              paVar33->z = paVar33->z - fVar16;
            }
          }
        }
        paVar21->mColors[1] = (aiColor4D *)0x1;
        pcOut->mMeshes[uVar40] = uVar45;
        uVar40 = (ulong)((int)uVar40 + 1);
      } while (uVar40 < (ulong)((long)local_128.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_128.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 2));
    }
  }
  uVar40 = (ulong)(uint)pcIn->mInstanceNumber;
  if (pcIn->mInstanceNumber < 2) {
    uVar40 = (pcIn->mName)._M_string_length;
    if (uVar40 < 0x400) {
      (pcOut->mName).length = (ai_uint32)uVar40;
      memcpy((pcOut->mName).data,(pcIn->mName)._M_dataplus._M_p,uVar40);
      (pcOut->mName).data[uVar40] = '\0';
    }
  }
  else {
    iVar30 = 1000000000;
    uVar45 = 1;
    param_4 = (aiMatrix4x4 *)0x0;
    pcVar47 = local_3c;
    do {
      pcVar48 = pcVar47;
      if (0xb < uVar45) break;
      lVar43 = (long)(int)uVar40 / (long)iVar30;
      uVar46 = (long)(int)uVar40 % (long)iVar30 & 0xffffffff;
      if (((param_4 == (aiMatrix4x4 *)0x0) && (iVar30 != 1)) && ((int)lVar43 == 0)) {
LAB_00738023:
        iVar30 = iVar30 / 10;
        bVar27 = true;
        pcVar48 = pcVar47;
      }
      else {
        pcVar48 = pcVar47 + 1;
        uVar45 = uVar45 + 1;
        *pcVar47 = (char)lVar43 + '0';
        param_4 = (aiMatrix4x4 *)0x1;
        uVar40 = uVar46;
        pcVar47 = pcVar48;
        if (iVar30 != 1) goto LAB_00738023;
        bVar27 = false;
        iVar30 = 1;
      }
      pcVar47 = pcVar48;
    } while (bVar27);
    *pcVar48 = '\0';
    pcVar22 = (pcIn->mName)._M_dataplus._M_p;
    local_e8._0_8_ = &local_e8.b1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,pcVar22,pcVar22 + (pcIn->mName)._M_string_length);
    std::__cxx11::string::append((char *)&local_e8);
    std::__cxx11::string::append((char *)&local_e8);
    uVar29 = local_e8._8_8_;
    if ((ulong)local_e8._8_8_ < 0x400) {
      (pcOut->mName).length = local_e8.a3;
      memcpy((pcOut->mName).data,(void *)local_e8._0_8_,local_e8._8_8_);
      (pcOut->mName).data[uVar29] = '\0';
    }
    if ((float *)local_e8._0_8_ != &local_e8.b1) {
      operator_delete((void *)local_e8._0_8_);
    }
  }
  this_00 = &pcIn->aRotationKeys;
  paVar34 = (pcIn->aRotationKeys).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((pcIn->aRotationKeys).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
      super__Vector_impl_data._M_finish == paVar34) {
    paVar35 = (pcIn->aCameraRollKeys).
              super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((pcIn->aCameraRollKeys).
        super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>.
        _M_impl.super__Vector_impl_data._M_finish != paVar35) {
      local_108 = paVar35->mValue * -0.017453292;
      (pcOut->mTransformation).a1 = 1.0;
      (pcOut->mTransformation).a2 = 0.0;
      (pcOut->mTransformation).a3 = 0.0;
      (pcOut->mTransformation).a4 = 0.0;
      (pcOut->mTransformation).b1 = 0.0;
      (pcOut->mTransformation).b2 = 1.0;
      (pcOut->mTransformation).b3 = 0.0;
      (pcOut->mTransformation).b4 = 0.0;
      (pcOut->mTransformation).c1 = 0.0;
      (pcOut->mTransformation).c2 = 0.0;
      (pcOut->mTransformation).c3 = 1.0;
      (pcOut->mTransformation).c4 = 0.0;
      (pcOut->mTransformation).d1 = 0.0;
      (pcOut->mTransformation).d2 = 0.0;
      (pcOut->mTransformation).d3 = 0.0;
      (pcOut->mTransformation).d4 = 1.0;
      fVar50 = cosf(local_108);
      (pcOut->mTransformation).b2 = fVar50;
      (pcOut->mTransformation).a1 = fVar50;
      fVar50 = sinf(local_108);
      (pcOut->mTransformation).b1 = fVar50;
      (pcOut->mTransformation).a2 = -fVar50;
    }
  }
  else {
    if (paVar34 !=
        (pcIn->aRotationKeys).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        (paVar34->mValue).w = -(paVar34->mValue).w;
        paVar34 = paVar34 + 1;
      } while (paVar34 !=
               (pcIn->aRotationKeys).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    paVar34 = (this_00->super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>)._M_impl.
              super__Vector_impl_data._M_start;
    fVar50 = (paVar34->mValue).y;
    fVar49 = (paVar34->mValue).z;
    fVar54 = (paVar34->mValue).x;
    fVar17 = fVar50 * fVar50 + fVar49 * fVar49;
    fVar55 = (paVar34->mValue).w;
    fVar18 = fVar54 * fVar50 - fVar49 * fVar55;
    fVar51 = fVar54 * fVar49 + fVar50 * fVar55;
    fVar15 = fVar49 * fVar55 + fVar54 * fVar50;
    fVar52 = fVar49 * fVar49 + fVar54 * fVar54;
    fVar53 = fVar50 * fVar49 - fVar54 * fVar55;
    fVar16 = fVar54 * fVar49 - fVar50 * fVar55;
    fVar49 = fVar54 * fVar55 + fVar50 * fVar49;
    fVar50 = fVar54 * fVar54 + fVar50 * fVar50;
    (pcOut->mTransformation).a1 = 1.0 - (fVar17 + fVar17);
    (pcOut->mTransformation).a2 = fVar18 + fVar18;
    (pcOut->mTransformation).a3 = fVar51 + fVar51;
    (pcOut->mTransformation).a4 = 0.0;
    (pcOut->mTransformation).b1 = fVar15 + fVar15;
    (pcOut->mTransformation).b2 = 1.0 - (fVar52 + fVar52);
    (pcOut->mTransformation).b3 = fVar53 + fVar53;
    (pcOut->mTransformation).b4 = 0.0;
    (pcOut->mTransformation).c1 = fVar16 + fVar16;
    (pcOut->mTransformation).c2 = fVar49 + fVar49;
    (pcOut->mTransformation).c3 = 1.0 - (fVar50 + fVar50);
    (pcOut->mTransformation).c4 = 0.0;
    (pcOut->mTransformation).d1 = 0.0;
    (pcOut->mTransformation).d2 = 0.0;
    (pcOut->mTransformation).d3 = 0.0;
    (pcOut->mTransformation).d4 = 1.0;
  }
  paVar23 = (pcIn->aScalingKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((pcIn->aScalingKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
      super__Vector_impl_data._M_finish != paVar23) {
    (pcOut->mTransformation).a1 = (paVar23->mValue).x * (pcOut->mTransformation).a1;
    (pcOut->mTransformation).b1 = (paVar23->mValue).x * (pcOut->mTransformation).b1;
    (pcOut->mTransformation).c1 = (paVar23->mValue).x * (pcOut->mTransformation).c1;
    (pcOut->mTransformation).a2 = (paVar23->mValue).y * (pcOut->mTransformation).a2;
    (pcOut->mTransformation).b2 = (paVar23->mValue).y * (pcOut->mTransformation).b2;
    (pcOut->mTransformation).c2 = (paVar23->mValue).y * (pcOut->mTransformation).c2;
    (pcOut->mTransformation).a3 = (paVar23->mValue).z * (pcOut->mTransformation).a3;
    (pcOut->mTransformation).b3 = (paVar23->mValue).z * (pcOut->mTransformation).b3;
    (pcOut->mTransformation).c3 = (paVar23->mValue).z * (pcOut->mTransformation).c3;
  }
  paVar23 = (pcIn->aPositionKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((pcIn->aPositionKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
      super__Vector_impl_data._M_finish != paVar23) {
    (pcOut->mTransformation).a4 = (paVar23->mValue).x + (pcOut->mTransformation).a4;
    (pcOut->mTransformation).b4 = (paVar23->mValue).y + (pcOut->mTransformation).b4;
    (pcOut->mTransformation).c4 = (paVar23->mValue).z + (pcOut->mTransformation).c4;
  }
  if (((1 < (ulong)(((long)(pcIn->aPositionKeys).
                           super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(pcIn->aPositionKeys).
                           super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) ||
      (1 < (ulong)(((long)(pcIn->aRotationKeys).
                          super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(pcIn->aRotationKeys).
                          super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3) * -0x5555555555555555))) ||
     ((1 < (ulong)(((long)(pcIn->aScalingKeys).
                          super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(pcIn->aScalingKeys).
                          super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) ||
      ((0x10 < (ulong)((long)(pcIn->aCameraRollKeys).
                             super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pcIn->aCameraRollKeys).
                            super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                            ._M_impl.super__Vector_impl_data._M_start) ||
       (1 < (ulong)(((long)(pcIn->aTargetPositionKeys).
                           super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(pcIn->aTargetPositionKeys).
                           super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3) * -0x5555555555555555))))))) {
    paVar24 = *pcSOut->mAnimations;
    if (paVar24 == (aiAnimation *)0x0) {
      __assert_fail("nullptr != anim",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/3DS/3DSConverter.cpp"
                    ,0x242,
                    "void Assimp::Discreet3DSImporter::AddNodeToGraph(aiScene *, aiNode *, D3DS::Node *, aiMatrix4x4 &)"
                   );
    }
    if (0x10 < (ulong)((long)(pcIn->aCameraRollKeys).
                             super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pcIn->aCameraRollKeys).
                            super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      pLVar32 = DefaultLogger::get();
      Logger::debug(pLVar32,"3DS: Converting camera roll track ...");
      std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::resize
                (this_00,(long)(pcIn->aCameraRollKeys).
                               super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pcIn->aCameraRollKeys).
                               super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4);
      paVar35 = (pcIn->aCameraRollKeys).
                super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((pcIn->aCameraRollKeys).
          super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>.
          _M_impl.super__Vector_impl_data._M_finish != paVar35) {
        uVar40 = 0;
        uVar46 = 1;
        do {
          paVar34 = (pcIn->aRotationKeys).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          paVar34[uVar40].mTime = paVar35[uVar40].mTime;
          local_a8 = paVar35[uVar40].mValue * 0.017453292 * 0.5;
          local_108 = sinf(local_a8);
          fVar50 = cosf(local_a8);
          fVar49 = fVar50 * 0.0;
          paVar34[uVar40].mValue.w = fVar50 + local_108 * 0.0;
          paVar34[uVar40].mValue.x = local_108 - fVar49;
          paVar34[uVar40].mValue.y = local_108 * 0.0 + fVar49;
          paVar34[uVar40].mValue.z = local_108 * -0.0 + fVar49;
          paVar35 = (pcIn->aCameraRollKeys).
                    super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          bVar27 = uVar46 < (ulong)((long)(pcIn->aCameraRollKeys).
                                          super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)paVar35
                                   >> 4);
          uVar40 = uVar46;
          uVar46 = (ulong)((int)uVar46 + 1);
        } while (bVar27);
      }
    }
    if (pcSOut->mNumCameras != 0) {
      uVar40 = 0;
      do {
        paVar25 = pcSOut->mCameras[uVar40];
        uVar45 = (paVar25->mName).length;
        if ((uVar45 == (pcOut->mName).length) &&
           (iVar30 = bcmp((paVar25->mName).data,(pcOut->mName).data,(ulong)uVar45), iVar30 == 0)) {
          (paVar25->mLookAt).x = 0.0;
          (paVar25->mLookAt).y = 0.0;
          (paVar25->mLookAt).z = 1.0;
        }
        uVar40 = uVar40 + 1;
      } while (uVar40 < pcSOut->mNumCameras);
    }
    if (pcSOut->mNumLights != 0) {
      uVar40 = 0;
      do {
        paVar26 = pcSOut->mLights[uVar40];
        uVar45 = (paVar26->mName).length;
        if ((uVar45 == (pcOut->mName).length) &&
           (iVar30 = bcmp((paVar26->mName).data,(pcOut->mName).data,(ulong)uVar45), iVar30 == 0)) {
          (paVar26->mDirection).x = 0.0;
          (paVar26->mDirection).y = 0.0;
          (paVar26->mDirection).z = 1.0;
        }
        uVar40 = uVar40 + 1;
      } while (uVar40 < pcSOut->mNumLights);
    }
    paVar36 = (aiNodeAnim *)operator_new(0x438);
    (paVar36->mNodeName).length = 0;
    (paVar36->mNodeName).data[0] = '\0';
    memset((paVar36->mNodeName).data + 1,0x1b,0x3ff);
    paVar36->mRotationKeys = (aiQuatKey *)0x0;
    paVar36->mNumScalingKeys = 0;
    *(undefined8 *)&paVar36->mNumPositionKeys = 0;
    *(undefined8 *)((long)&paVar36->mPositionKeys + 4) = 0;
    paVar36->mScalingKeys = (aiVectorKey *)0x0;
    paVar36->mPreState = aiAnimBehaviour_DEFAULT;
    paVar36->mPostState = aiAnimBehaviour_DEFAULT;
    uVar45 = paVar24->mNumChannels;
    paVar24->mNumChannels = uVar45 + 1;
    paVar24->mChannels[uVar45] = paVar36;
    uVar40 = (pcIn->mName)._M_string_length;
    if (uVar40 < 0x400) {
      (paVar36->mNodeName).length = (ai_uint32)uVar40;
      memcpy((paVar36->mNodeName).data,(pcIn->mName)._M_dataplus._M_p,uVar40);
      (paVar36->mNodeName).data[uVar40] = '\0';
    }
    paVar23 = (pcIn->aPositionKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
              _M_impl.super__Vector_impl_data._M_start;
    lVar43 = (long)(pcIn->aPositionKeys).
                   super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)paVar23;
    if (lVar43 != 0) {
      uVar46 = (lVar43 >> 3) * -0x5555555555555555;
      paVar36->mNumPositionKeys = (uint)uVar46;
      uVar40 = (uVar46 & 0xffffffff) * 0x18;
      paVar37 = (aiVectorKey *)operator_new__(uVar40);
      if ((uVar46 & 0xffffffff) != 0) {
        uVar42 = 0;
        do {
          puVar3 = (undefined8 *)((long)&paVar37->mTime + uVar42);
          *puVar3 = 0;
          puVar3[1] = 0;
          *(undefined4 *)((long)&(paVar37->mValue).z + uVar42) = 0;
          uVar42 = uVar42 + 0x18;
        } while (uVar40 != uVar42);
      }
      paVar36->mPositionKeys = paVar37;
      memcpy(paVar37,paVar23,(uVar46 & 0xffffffff) * 0x18);
    }
    lVar43 = (long)(pcIn->aRotationKeys).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pcIn->aRotationKeys).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    if (lVar43 != 0) {
      uVar45 = (int)(lVar43 >> 3) * -0x55555555;
      paVar36->mNumRotationKeys = uVar45;
      uVar40 = (ulong)uVar45;
      paVar38 = (aiQuatKey *)operator_new__(uVar40 * 0x18);
      if (uVar40 != 0) {
        paVar44 = paVar38;
        do {
          paVar44->mTime = 0.0;
          (paVar44->mValue).w = 1.0;
          (paVar44->mValue).x = 0.0;
          (paVar44->mValue).y = 0.0;
          (paVar44->mValue).z = 0.0;
          paVar44 = paVar44 + 1;
        } while (paVar44 != paVar38 + uVar40);
      }
      paVar36->mRotationKeys = paVar38;
      if (paVar36->mNumRotationKeys != 0) {
        fVar50 = 0.0;
        fVar49 = 0.0;
        fVar54 = 1.0;
        fVar55 = 0.0;
        lVar43 = 0;
        uVar40 = 0;
        do {
          paVar34 = (this_00->super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          if (lVar43 == 0) {
            fVar15 = (paVar34->mValue).w;
            fVar17 = (paVar34->mValue).x;
            fVar55 = 0.0;
            fVar49 = 0.0;
            fVar16 = (paVar34->mValue).y;
            fVar18 = (paVar34->mValue).z;
          }
          else {
            fVar18 = *(float *)((long)&(paVar34->mValue).w + lVar43);
            fVar51 = *(float *)((long)&(paVar34->mValue).x + lVar43);
            fVar52 = *(float *)((long)&(paVar34->mValue).y + lVar43);
            fVar53 = *(float *)((long)&(paVar34->mValue).z + lVar43);
            fVar15 = ((fVar54 * fVar18 - fVar51 * fVar55) - fVar50 * fVar52) - fVar49 * fVar53;
            fVar17 = (fVar50 * fVar53 + fVar54 * fVar51 + fVar55 * fVar18) - fVar49 * fVar52;
            fVar16 = (fVar49 * fVar51 + fVar54 * fVar52 + fVar50 * fVar18) - fVar55 * fVar53;
            fVar18 = (fVar55 * fVar52 + fVar54 * fVar53 + fVar49 * fVar18) - fVar50 * fVar51;
          }
          *(undefined8 *)((long)&paVar36->mRotationKeys->mTime + lVar43) =
               *(undefined8 *)((long)&paVar34->mTime + lVar43);
          fVar51 = fVar15 * fVar15 + fVar18 * fVar18 + fVar17 * fVar17 + fVar16 * fVar16;
          if (fVar51 < 0.0) {
            local_108 = fVar16;
            fStack_104 = fVar18;
            fStack_100 = fVar49;
            fStack_fc = fVar55;
            local_a8 = fVar15;
            fStack_a4 = fVar17;
            fStack_a0 = fVar55;
            fStack_9c = fVar49;
            local_98 = fVar18;
            fStack_94 = fVar18;
            fStack_90 = fVar18;
            fStack_8c = fVar18;
            local_88 = fVar17;
            fStack_84 = fVar17;
            fStack_80 = fVar17;
            fStack_7c = fVar17;
            fVar51 = sqrtf(fVar51);
            fVar17 = local_88;
            fVar18 = local_98;
            fVar50 = local_108;
            fVar49 = fStack_104;
            fVar54 = local_a8;
            fVar55 = fStack_a4;
          }
          else {
            fVar51 = SQRT(fVar51);
            fVar50 = fVar16;
            fVar49 = fVar18;
            fVar54 = fVar15;
            fVar55 = fVar17;
          }
          if ((fVar51 != 0.0) || (NAN(fVar51))) {
            fVar51 = 1.0 / fVar51;
            fVar55 = fVar17 * fVar51;
            fVar50 = fVar50 * fVar51;
            fVar49 = fVar18 * fVar51;
            fVar54 = fVar54 * fVar51;
          }
          pfVar2 = (float *)((long)&(paVar36->mRotationKeys->mValue).w + lVar43);
          *pfVar2 = fVar54;
          pfVar2[1] = fVar55;
          pfVar2[2] = fVar50;
          pfVar2[3] = fVar49;
          uVar40 = uVar40 + 1;
          lVar43 = lVar43 + 0x18;
        } while (uVar40 < paVar36->mNumRotationKeys);
      }
    }
    paVar23 = (pcIn->aScalingKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
              _M_impl.super__Vector_impl_data._M_start;
    lVar43 = (long)(pcIn->aScalingKeys).
                   super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)paVar23;
    if (lVar43 != 0) {
      uVar46 = (lVar43 >> 3) * -0x5555555555555555;
      paVar36->mNumScalingKeys = (uint)uVar46;
      uVar40 = (uVar46 & 0xffffffff) * 0x18;
      paVar37 = (aiVectorKey *)operator_new__(uVar40);
      if ((uVar46 & 0xffffffff) != 0) {
        uVar42 = 0;
        do {
          puVar3 = (undefined8 *)((long)&paVar37->mTime + uVar42);
          *puVar3 = 0;
          puVar3[1] = 0;
          *(undefined4 *)((long)&(paVar37->mValue).z + uVar42) = 0;
          uVar42 = uVar42 + 0x18;
        } while (uVar40 != uVar42);
      }
      paVar36->mScalingKeys = paVar37;
      memcpy(paVar37,paVar23,(uVar46 & 0xffffffff) * 0x18);
    }
  }
  pcOut->mNumChildren =
       (uint)((ulong)((long)(pcIn->mChildren).
                            super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pcIn->mChildren).
                           super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3);
  uVar46 = (long)(pcIn->mChildren).
                 super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(pcIn->mChildren).
                 super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  uVar40 = 0xffffffffffffffff;
  if (-1 < (long)uVar46) {
    uVar40 = uVar46;
  }
  ppaVar39 = (aiNode **)operator_new__(uVar40);
  this_01 = local_70;
  pcOut->mChildren = ppaVar39;
  uVar40 = (ulong)((long)(pcIn->mChildren).
                         super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pcIn->mChildren).
                        super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 3;
  if ((int)uVar40 != 0) {
    uVar46 = 0;
    do {
      this_02 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(this_02);
      pcOut->mChildren[uVar46] = this_02;
      pcOut->mChildren[uVar46]->mParent = pcOut;
      AddNodeToGraph(this_01,pcSOut,pcOut->mChildren[uVar46],
                     (pcIn->mChildren).
                     super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar46],param_4);
      uVar46 = uVar46 + 1;
    } while ((uVar40 & 0xffffffff) != uVar46);
  }
  if (local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Discreet3DSImporter::AddNodeToGraph(aiScene* pcSOut,aiNode* pcOut,
    D3DS::Node* pcIn, aiMatrix4x4& /*absTrafo*/)
{
    std::vector<unsigned int> iArray;
    iArray.reserve(3);

    aiMatrix4x4 abs;

    // Find all meshes with the same name as the node
    for (unsigned int a = 0; a < pcSOut->mNumMeshes;++a)
    {
        const D3DS::Mesh* pcMesh = (const D3DS::Mesh*)pcSOut->mMeshes[a]->mColors[0];
        ai_assert(NULL != pcMesh);

        if (pcIn->mName == pcMesh->mName)
            iArray.push_back(a);
    }
    if (!iArray.empty())
    {
        // The matrix should be identical for all meshes with the
        // same name. It HAS to be identical for all meshes .....
        D3DS::Mesh* imesh = ((D3DS::Mesh*)pcSOut->mMeshes[iArray[0]]->mColors[0]);

        // Compute the inverse of the transformation matrix to move the
        // vertices back to their relative and local space
        aiMatrix4x4 mInv = imesh->mMat, mInvTransposed = imesh->mMat;
        mInv.Inverse();mInvTransposed.Transpose();
        aiVector3D pivot = pcIn->vPivot;

        pcOut->mNumMeshes = (unsigned int)iArray.size();
        pcOut->mMeshes = new unsigned int[iArray.size()];
        for (unsigned int i = 0;i < iArray.size();++i)  {
            const unsigned int iIndex = iArray[i];
            aiMesh* const mesh = pcSOut->mMeshes[iIndex];

            if (mesh->mColors[1] == NULL)
            {
                // Transform the vertices back into their local space
                // fixme: consider computing normals after this, so we don't need to transform them
                const aiVector3D* const pvEnd = mesh->mVertices + mesh->mNumVertices;
                aiVector3D* pvCurrent = mesh->mVertices, *t2 = mesh->mNormals;

                for (; pvCurrent != pvEnd; ++pvCurrent, ++t2) {
                    *pvCurrent = mInv * (*pvCurrent);
                    *t2 = mInvTransposed * (*t2);
                }

                // Handle negative transformation matrix determinant -> invert vertex x
                if (imesh->mMat.Determinant() < 0.0f)
                {
                    /* we *must* have normals */
                    for (pvCurrent = mesh->mVertices, t2 = mesh->mNormals; pvCurrent != pvEnd; ++pvCurrent, ++t2) {
                        pvCurrent->x *= -1.f;
                        t2->x *= -1.f;
                    }
                    ASSIMP_LOG_INFO("3DS: Flipping mesh X-Axis");
                }

                // Handle pivot point
                if (pivot.x || pivot.y || pivot.z)
                {
                    for (pvCurrent = mesh->mVertices; pvCurrent != pvEnd; ++pvCurrent)  {
                        *pvCurrent -= pivot;
                    }
                }

                mesh->mColors[1] = (aiColor4D*)1;
            }
            else
                mesh->mColors[1] = (aiColor4D*)1;

            // Setup the mesh index
            pcOut->mMeshes[i] = iIndex;
        }
    }

    // Setup the name of the node
    // First instance keeps its name otherwise something might break, all others will be postfixed with their instance number
    if (pcIn->mInstanceNumber > 1)
    {
        char tmp[12];
        ASSIMP_itoa10(tmp, pcIn->mInstanceNumber);
        std::string tempStr = pcIn->mName + "_inst_";
        tempStr += tmp;
        pcOut->mName.Set(tempStr);
    }
    else
        pcOut->mName.Set(pcIn->mName);

    // Now build the transformation matrix of the node
    // ROTATION
    if (pcIn->aRotationKeys.size()){

        // FIX to get to Assimp's quaternion conventions
        for (std::vector<aiQuatKey>::iterator it = pcIn->aRotationKeys.begin(); it != pcIn->aRotationKeys.end(); ++it) {
            (*it).mValue.w *= -1.f;
        }

        pcOut->mTransformation = aiMatrix4x4( pcIn->aRotationKeys[0].mValue.GetMatrix() );
    }
    else if (pcIn->aCameraRollKeys.size())
    {
        aiMatrix4x4::RotationZ(AI_DEG_TO_RAD(- pcIn->aCameraRollKeys[0].mValue),
            pcOut->mTransformation);
    }

    // SCALING
    aiMatrix4x4& m = pcOut->mTransformation;
    if (pcIn->aScalingKeys.size())
    {
        const aiVector3D& v = pcIn->aScalingKeys[0].mValue;
        m.a1 *= v.x; m.b1 *= v.x; m.c1 *= v.x;
        m.a2 *= v.y; m.b2 *= v.y; m.c2 *= v.y;
        m.a3 *= v.z; m.b3 *= v.z; m.c3 *= v.z;
    }

    // TRANSLATION
    if (pcIn->aPositionKeys.size())
    {
        const aiVector3D& v = pcIn->aPositionKeys[0].mValue;
        m.a4 += v.x;
        m.b4 += v.y;
        m.c4 += v.z;
    }

    // Generate animation channels for the node
    if (pcIn->aPositionKeys.size()  > 1  || pcIn->aRotationKeys.size()   > 1 ||
        pcIn->aScalingKeys.size()   > 1  || pcIn->aCameraRollKeys.size() > 1 ||
        pcIn->aTargetPositionKeys.size() > 1)
    {
        aiAnimation* anim = pcSOut->mAnimations[0];
        ai_assert(nullptr != anim);

        if (pcIn->aCameraRollKeys.size() > 1)
        {
            ASSIMP_LOG_DEBUG("3DS: Converting camera roll track ...");

            // Camera roll keys - in fact they're just rotations
            // around the camera's z axis. The angles are given
            // in degrees (and they're clockwise).
            pcIn->aRotationKeys.resize(pcIn->aCameraRollKeys.size());
            for (unsigned int i = 0; i < pcIn->aCameraRollKeys.size();++i)
            {
                aiQuatKey&  q = pcIn->aRotationKeys[i];
                aiFloatKey& f = pcIn->aCameraRollKeys[i];

                q.mTime  = f.mTime;

                // FIX to get to Assimp quaternion conventions
                q.mValue = aiQuaternion(0.f,0.f,AI_DEG_TO_RAD( /*-*/ f.mValue));
            }
        }
#if 0
        if (pcIn->aTargetPositionKeys.size() > 1)
        {
            ASSIMP_LOG_DEBUG("3DS: Converting target track ...");

            // Camera or spot light - need to convert the separate
            // target position channel to our representation
            TargetAnimationHelper helper;

            if (pcIn->aPositionKeys.empty())
            {
                // We can just pass zero here ...
                helper.SetFixedMainAnimationChannel(aiVector3D());
            }
            else  helper.SetMainAnimationChannel(&pcIn->aPositionKeys);
            helper.SetTargetAnimationChannel(&pcIn->aTargetPositionKeys);

            // Do the conversion
            std::vector<aiVectorKey> distanceTrack;
            helper.Process(&distanceTrack);

            // Now add a new node as child, name it <ourName>.Target
            // and assign the distance track to it. This is that the
            // information where the target is and how it moves is
            // not lost
            D3DS::Node* nd = new D3DS::Node();
            pcIn->push_back(nd);

            nd->mName = pcIn->mName + ".Target";

            aiNodeAnim* nda = anim->mChannels[anim->mNumChannels++] = new aiNodeAnim();
            nda->mNodeName.Set(nd->mName);

            nda->mNumPositionKeys = (unsigned int)distanceTrack.size();
            nda->mPositionKeys = new aiVectorKey[nda->mNumPositionKeys];
            ::memcpy(nda->mPositionKeys,&distanceTrack[0],
                sizeof(aiVectorKey)*nda->mNumPositionKeys);
        }
#endif

        // Cameras or lights define their transformation in their parent node and in the
        // corresponding light or camera chunks. However, we read and process the latter
        // to to be able to return valid cameras/lights even if no scenegraph is given.
        for (unsigned int n = 0; n < pcSOut->mNumCameras;++n)   {
            if (pcSOut->mCameras[n]->mName == pcOut->mName) {
                pcSOut->mCameras[n]->mLookAt = aiVector3D(0.f,0.f,1.f);
            }
        }
        for (unsigned int n = 0; n < pcSOut->mNumLights;++n)    {
            if (pcSOut->mLights[n]->mName == pcOut->mName) {
                pcSOut->mLights[n]->mDirection = aiVector3D(0.f,0.f,1.f);
            }
        }

        // Allocate a new node anim and setup its name
        aiNodeAnim* nda = anim->mChannels[anim->mNumChannels++] = new aiNodeAnim();
        nda->mNodeName.Set(pcIn->mName);

        // POSITION keys
        if (pcIn->aPositionKeys.size()  > 0)
        {
            nda->mNumPositionKeys = (unsigned int)pcIn->aPositionKeys.size();
            nda->mPositionKeys = new aiVectorKey[nda->mNumPositionKeys];
            ::memcpy(nda->mPositionKeys,&pcIn->aPositionKeys[0],
                sizeof(aiVectorKey)*nda->mNumPositionKeys);
        }

        // ROTATION keys
        if (pcIn->aRotationKeys.size()  > 0)
        {
            nda->mNumRotationKeys = (unsigned int)pcIn->aRotationKeys.size();
            nda->mRotationKeys = new aiQuatKey[nda->mNumRotationKeys];

            // Rotations are quaternion offsets
            aiQuaternion abs1;
            for (unsigned int n = 0; n < nda->mNumRotationKeys;++n)
            {
                const aiQuatKey& q = pcIn->aRotationKeys[n];

                abs1 = (n ? abs1 * q.mValue : q.mValue);
                nda->mRotationKeys[n].mTime  = q.mTime;
                nda->mRotationKeys[n].mValue = abs1.Normalize();
            }
        }

        // SCALING keys
        if (pcIn->aScalingKeys.size()  > 0)
        {
            nda->mNumScalingKeys = (unsigned int)pcIn->aScalingKeys.size();
            nda->mScalingKeys = new aiVectorKey[nda->mNumScalingKeys];
            ::memcpy(nda->mScalingKeys,&pcIn->aScalingKeys[0],
                sizeof(aiVectorKey)*nda->mNumScalingKeys);
        }
    }

    // Allocate storage for children
    pcOut->mNumChildren = (unsigned int)pcIn->mChildren.size();
    pcOut->mChildren = new aiNode*[pcIn->mChildren.size()];

    // Recursively process all children
    const unsigned int size = static_cast<unsigned int>(pcIn->mChildren.size());
    for (unsigned int i = 0; i < size;++i)
    {
        pcOut->mChildren[i] = new aiNode();
        pcOut->mChildren[i]->mParent = pcOut;
        AddNodeToGraph(pcSOut,pcOut->mChildren[i],pcIn->mChildren[i],abs);
    }
}